

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O0

void ftr2e_(float *A1,int *A2,char *A3,int *A4,size_t C3)

{
  float fval;
  int decim;
  char *s;
  char *cval;
  size_t sVar1;
  size_t sVar2;
  size_t local_80;
  unsigned_long local_68;
  char local_58 [8];
  char str [21];
  char *B3;
  size_t C3_local;
  int *A4_local;
  char *A3_local;
  int *A2_local;
  float *A1_local;
  
  fval = *A1;
  decim = *A2;
  local_68 = C3;
  if (C3 <= gMinStrLen) {
    local_68 = gMinStrLen;
  }
  s = (char *)malloc(local_68 + 1);
  s[C3] = '\0';
  memcpy(s,A3,C3);
  cval = kill_trailing(s,' ');
  ffr2e(fval,decim,cval,A4);
  snprintf(local_58,0x15,"%20s",s);
  strcpy(s,local_58);
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    local_80 = C3;
    if (sVar1 < C3) {
      local_80 = strlen(s);
    }
    memcpy(A3,s,local_80);
    sVar1 = strlen(s);
    if (sVar1 < C3) {
      sVar1 = strlen(s);
      sVar2 = strlen(s);
      memset(A3 + sVar1,0x20,C3 - sVar2);
    }
    free(s);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTR2E,ftr2e)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FLOAT,INT,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FLOAT,1)
   QCF(INT,2)
   QCF(PSTRING,3)
   QCF(PINT,4)
   char str[21];

   ffr2e( TCF(ftr2e,FLOAT,1,0) 
          TCF(ftr2e,INT,2,1) 
          TCF(ftr2e,PSTRING,3,1) 
          TCF(ftr2e,PINT,4,1) );

   snprintf(str,21,"%20s",B3);
   strcpy(B3,str);

   RCF(FLOAT,1)
   RCF(INT,2)
   RCF(PSTRING,3)
   RCF(PINT,4)
}